

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O2

bool testFromStdString(String *str)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  
  pcVar4 = (str->view_)._M_str;
  if (pcVar4 == stdstr_abi_cxx11_._M_dataplus._M_p) {
    iVar2 = 0xa7;
    pcVar4 = "ASSERT_TRUE(str.data() != stdstr.data()) failed on line ";
  }
  else if ((str->view_)._M_len == 3) {
    iVar2 = strncmp(pcVar4,stdstr_abi_cxx11_._M_dataplus._M_p,3);
    if (iVar2 == 0) {
      bVar1 = cm::String::is_stable(str);
      if (bVar1) {
        return true;
      }
      iVar2 = 0xab;
      pcVar4 = "ASSERT_TRUE(str.is_stable()) failed on line ";
    }
    else {
      iVar2 = 0xaa;
      pcVar4 = "ASSERT_TRUE(std::strncmp(str.data(), stdstr.data(), 3) == 0) failed on line ";
    }
  }
  else {
    iVar2 = 0xa9;
    pcVar4 = "ASSERT_TRUE(str.size() == 3) failed on line ";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,"\n");
  return false;
}

Assistant:

static bool testFromStdString(cm::String const& str)
{
#if defined(_GLIBCXX_USE_CXX11_ABI) && _GLIBCXX_USE_CXX11_ABI
  // It would be nice to check this everywhere, but several platforms
  // still use a CoW implementation even in C++11.
  ASSERT_TRUE(str.data() != stdstr.data());
#endif
  ASSERT_TRUE(str.size() == 3);
  ASSERT_TRUE(std::strncmp(str.data(), stdstr.data(), 3) == 0);
  ASSERT_TRUE(str.is_stable());
  return true;
}